

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O0

int doloot(void)

{
  obj *obj;
  monst *pmVar1;
  boolean bVar2;
  uint uVar3;
  int iVar4;
  permonst *ptr;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  monst *local_b8;
  int local_a4;
  char local_91;
  monst *pmStack_90;
  schar dz;
  monst *mon;
  obj *poStack_80;
  int pass;
  obj *coffers;
  long contribution;
  obj *goldob;
  int tmp;
  int qflags;
  int n;
  int i;
  object_pick *lootlist;
  boolean local_45;
  int container_count;
  boolean prev_loot;
  monst *pmStack_40;
  int prev_inquiry;
  monst *mtmp;
  char *dont_find_anything;
  uint local_28;
  boolean underfoot;
  int iStack_24;
  coord cc;
  int timepassed;
  int c;
  obj *pobj;
  obj *cobj;
  
  iStack_24 = -1;
  local_28 = 0;
  dont_find_anything._5_1_ = '\x01';
  mtmp = (monst *)anon_var_dwarf_7f081;
  container_count = 0;
  local_45 = '\0';
  lootlist._4_4_ = 0;
  bVar2 = check_capacity((char *)0x0);
  if (bVar2 == '\0') {
    if (((youmonst.data)->mflags1 & 0x2000) == 0) {
      dont_find_anything._6_1_ = u.ux;
      dont_find_anything._7_1_ = u.uy;
      do {
        lootlist._4_4_ =
             container_at((int)dont_find_anything._6_1_,(int)dont_find_anything._7_1_,'\x01');
        if (lootlist._4_4_ == 0) {
          if (u.uprops[0x1c].intrinsic == 0) {
            if (level->locations[dont_find_anything._6_1_][dont_find_anything._7_1_].typ == ' ') {
              pline("You need to dig up the grave to effectively loot it...");
            }
          }
          else {
            for (contribution = (long)invent;
                (contribution != 0 && (*(char *)(contribution + 0x35) != '\f'));
                contribution = *(long *)contribution) {
            }
            if (contribution != 0) {
              if (*(int *)(contribution + 0x30) < 0x8000) {
                local_a4 = *(int *)(contribution + 0x30);
              }
              else {
                local_a4 = 0x7fff;
              }
              iVar4 = rnd(local_a4);
              coffers = (obj *)(long)iVar4;
              if ((long)coffers < (long)*(int *)(contribution + 0x30)) {
                contribution = (long)splitobj((obj *)contribution,(long)coffers);
              }
              freeinv((obj *)contribution);
              if (level->locations[u.ux][u.uy].typ == '\x1d') {
                for (mon._4_4_ = 2; -1 < mon._4_4_; mon._4_4_ = mon._4_4_ + -2) {
                  for (poStack_80 = level->objlist; poStack_80 != (obj *)0x0;
                      poStack_80 = poStack_80->nobj) {
                    if (((poStack_80->otyp == 0xdb) || (poStack_80->otyp == 0xdc)) &&
                       (poStack_80->spe == mon._4_4_)) goto LAB_0028b3e5;
                  }
                }
LAB_0028b3e5:
                if (poStack_80 == (obj *)0x0) {
                  ptr = courtmon(&u.uz);
                  pmStack_90 = makemon(ptr,level,(int)u.ux,(int)u.uy,0);
                  if (pmStack_90 == (monst *)0x0) {
                    dropy((obj *)contribution);
                  }
                  else {
                    add_to_minv(pmStack_90,(obj *)contribution);
                    pline("The exchequer accepts your contribution.");
                    iVar4 = rn2(0x32);
                    if (iVar4 == 0) {
                      level->locations[u.ux][u.uy].typ = '\x19';
                      pline("The throne vanishes in a puff of logic.");
                      newsym((int)u.ux,(int)u.uy);
                    }
                  }
                }
                else {
                  verbalize("Thank you for your contribution to reduce the debt.");
                  add_to_container(poStack_80,(obj *)contribution);
                  uVar3 = weight(poStack_80);
                  poStack_80->owt = uVar3;
                }
              }
              else {
                dropy((obj *)contribution);
                pline("Ok, now there is loot here.");
              }
              local_28 = 1;
            }
          }
        }
        else {
          bVar2 = able_to_loot((int)dont_find_anything._6_1_,(int)dont_find_anything._7_1_,"loot");
          if (bVar2 == '\0') {
            return 0;
          }
          goldob._4_4_ = 0x21;
          if (iflags.paranoid_loot == '\0') {
            goldob._4_4_ = 0x23;
          }
          if (level->locations[dont_find_anything._6_1_][dont_find_anything._7_1_].typ == '\x1e') {
            goldob._4_4_ = goldob._4_4_ | 0x80;
          }
          tmp = query_objlist("Loot which containers?",
                              level->objects[dont_find_anything._6_1_][dont_find_anything._7_1_],
                              goldob._4_4_,(object_pick **)&n,2,Is_container_func);
          if (tmp < 0) {
            return 0;
          }
          if (tmp == 0) {
            iStack_24 = 0x6e;
          }
          else if (0 < tmp) {
            iStack_24 = 0x79;
            for (qflags = 0; qflags < tmp; qflags = qflags + 1) {
              obj = _n[qflags].obj;
              if ((obj == &zeroobj) || ((*(uint *)&obj->field_0x4a >> 0xd & 1) == 0)) {
                if ((obj != &zeroobj) && ((obj->otyp == 0xe1 && ('\0' < obj->spe)))) {
                  pline("You carefully open the bag...");
                  bVar7 = false;
                  if (u.uprops[0x23].intrinsic != 0) {
                    bVar7 = true;
                    if ((u.uprops[0x24].extrinsic == 0) && (bVar7 = false, u.umonnum != u.umonster))
                    {
                      bVar2 = dmgtype(youmonst.data,0x24);
                      bVar7 = bVar2 != '\0';
                    }
                    bVar7 = (bool)(bVar7 ^ 1);
                  }
                  pcVar5 = "teeth and bites";
                  if (bVar7) {
                    pcVar5 = "lips and kisses";
                  }
                  pline("It develops a huge set of %s you!",pcVar5);
                  goldob._0_4_ = rnd(10);
                  if ((u.uprops[0x33].intrinsic != 0) || (u.uprops[0x33].extrinsic != 0)) {
                    goldob._0_4_ = ((int)goldob + 1) / 2;
                  }
                  iVar4 = (int)goldob;
                  bVar7 = false;
                  if (u.uprops[0x23].intrinsic != 0) {
                    bVar7 = true;
                    if ((u.uprops[0x24].extrinsic == 0) && (bVar7 = false, u.umonnum != u.umonster))
                    {
                      bVar2 = dmgtype(youmonst.data,0x24);
                      bVar7 = bVar2 != '\0';
                    }
                    bVar7 = (bool)(bVar7 ^ 1);
                  }
                  pcVar5 = "carnivorous bag";
                  if (bVar7) {
                    pcVar5 = "amorous bag";
                  }
                  losehp(iVar4,pcVar5,0);
                  discover_object(0xe1,'\x01','\x01');
                  free(_n);
                  return 1;
                }
                if (obj == &zeroobj) {
                  pline("You carefully open the magic chest...");
                }
                else {
                  pcVar5 = xname(obj);
                  the(pcVar5);
                  pline("You carefully open %s...");
                }
                uVar3 = use_container(obj,0);
                local_28 = uVar3 | local_28;
                if (multi < 0) {
                  free(_n);
                  return 1;
                }
              }
              else {
                pline("Hmmm, it seems to be locked.");
                if (flags.autounlock != '\0') {
                  if (obj->otyp == 0xdc) {
                    _timepassed = carrying(0xf2);
                  }
                  else {
                    _timepassed = carrying(0xe2);
                    if (_timepassed == (obj *)0x0) {
                      _timepassed = carrying(0xe3);
                    }
                    if (_timepassed == (obj *)0x0) {
                      _timepassed = carrying(0xe4);
                    }
                  }
                  if ((_timepassed != (obj *)0x0) &&
                     (iVar4 = pick_lock(_timepassed,(int)dont_find_anything._6_1_,
                                        (int)dont_find_anything._7_1_,'\x01','\x01'), iVar4 != 0)) {
                    free(_n);
                    return 1;
                  }
                }
              }
            }
            free(_n);
          }
        }
        if ((iStack_24 == 0x79) || (bVar2 = mon_beside((int)u.ux,(int)u.uy), bVar2 == '\0')) {
          if ((iStack_24 != 0x79) && (iStack_24 != 0x6e)) {
            pcVar5 = "there";
            if (dont_find_anything._5_1_ != '\0') {
              pcVar5 = "here";
            }
            pline("You %s %s to loot.",mtmp,pcVar5);
          }
          goto LAB_0028b85b;
        }
        iVar4 = get_adjacent_loc("Loot in what direction?","Invalid loot location",u.ux,u.uy,
                                 (coord *)((long)&dont_find_anything + 6),&local_91);
        if (iVar4 == 0) {
          return local_28;
        }
        if ((dont_find_anything._6_1_ != u.ux) || (dont_find_anything._7_1_ != u.uy)) {
          dont_find_anything._5_1_ = '\0';
          break;
        }
        dont_find_anything._5_1_ = '\x01';
        iVar4 = container_at((int)dont_find_anything._6_1_,(int)dont_find_anything._7_1_,'\0');
      } while (iVar4 != 0);
      pmVar1 = mtmp;
      if (local_91 < '\0') {
        pcVar5 = ceiling((int)dont_find_anything._6_1_,(int)dont_find_anything._7_1_);
        pline("You %s to loot on the %s.",pmVar1,pcVar5);
        cobj._4_4_ = 1;
      }
      else {
        if ((level->monsters[dont_find_anything._6_1_][dont_find_anything._7_1_] == (monst *)0x0) ||
           ((*(uint *)&level->monsters[dont_find_anything._6_1_][dont_find_anything._7_1_]->
                       field_0x60 >> 9 & 1) != 0)) {
          local_b8 = (monst *)0x0;
        }
        else {
          local_b8 = level->monsters[dont_find_anything._6_1_][dont_find_anything._7_1_];
        }
        pmStack_40 = local_b8;
        if (local_b8 != (monst *)0x0) {
          local_28 = loot_mon(local_b8,&container_count,&local_45);
        }
        if (dont_find_anything._5_1_ == '\0') {
          iVar4 = container_at((int)dont_find_anything._6_1_,(int)dont_find_anything._7_1_,'\0');
          if (iVar4 == 0) {
            pcVar5 = "";
            if (container_count != 0 || local_45 != '\0') {
              pcVar5 = "else ";
            }
            pline("You %s %sthere to loot.",mtmp,pcVar5);
            return local_28;
          }
          if (pmStack_40 != (monst *)0x0) {
            pcVar5 = "";
            if (container_count != 0) {
              pcVar5 = "else ";
            }
            pcVar6 = mon_nam(pmStack_40);
            pline("You can\'t loot anything %sthere with %s in the way.",pcVar5,pcVar6);
            return local_28;
          }
          pline("You have to be at a container to loot it.");
        }
LAB_0028b85b:
        cobj._4_4_ = local_28;
      }
    }
    else {
      pline("You have no hands!");
      cobj._4_4_ = 0;
    }
  }
  else {
    cobj._4_4_ = 0;
  }
  return cobj._4_4_;
}

Assistant:

int doloot(void)
{
    struct obj *cobj, *pobj;
    int c = -1;
    int timepassed = 0;
    coord cc;
    boolean underfoot = TRUE;
    const char *dont_find_anything = "don't find anything";
    struct monst *mtmp;
    int prev_inquiry = 0;
    boolean prev_loot = FALSE;
    int container_count = 0;

    if (check_capacity(NULL)) {
	/* "Can't do that while carrying so much stuff." */
	return 0;
    }
    if (nohands(youmonst.data)) {
	pline("You have no hands!");	/* not `body_part(HAND)' */
	return 0;
    }
    cc.x = u.ux; cc.y = u.uy;

lootcont:

    if ((container_count = container_at(cc.x, cc.y, TRUE))) {
	struct object_pick *lootlist;
	int i, n;
	int qflags;

	if (!able_to_loot(cc.x, cc.y, "loot")) return 0;

	qflags = BY_NEXTHERE|SIGNAL_ESCAPE;
	if (!iflags.paranoid_loot)
	    qflags |= AUTOSELECT_SINGLE;
	if (IS_MAGIC_CHEST(level->locations[cc.x][cc.y].typ))
	    qflags |= SHOW_MAGIC_CHEST;
	n = query_objlist("Loot which containers?", level->objects[cc.x][cc.y],
			  qflags, &lootlist, PICK_ANY, Is_container_func);

	if (n < 0) {
	    return 0;
	} else if (n == 0) {
	    c = 'n';
	} else if (n > 0) {
	    c = 'y';
	    for (i = 0; i < n; i++) {
		cobj = lootlist[i].obj;
		if (!cobj_is_magic_chest(cobj) && cobj->olocked) {
		    pline("Hmmm, it seems to be locked.");
		    if (flags.autounlock) {
			pobj = NULL;
			if (cobj->otyp == IRON_SAFE) {
			    pobj = carrying(STETHOSCOPE);
			} else {
			    pobj = carrying(SKELETON_KEY);
			    if (!pobj) pobj = carrying(LOCK_PICK);
			    if (!pobj) pobj = carrying(CREDIT_CARD);
			}
			if (pobj) {
			    if (pick_lock(pobj, cc.x, cc.y, TRUE, TRUE)) {
				/* Non-zero return technically only means it
				 * took time, but it also conveniently means
				 * that unlocking is beginning to take place,
				 * so duck out of this container loop in that
				 * case. */
				free(lootlist);
				return 1;
			    }
			}
		    }
		    continue;
		}
		if (!cobj_is_magic_chest(cobj) &&
			cobj->otyp == BAG_OF_TRICKS && cobj->spe > 0) {
		    int tmp;
		    pline("You carefully open the bag...");
		    pline("It develops a huge set of %s you!",
			  Hallucination ? "lips and kisses" : "teeth and bites");
		    tmp = rnd(10);
		    if (Half_physical_damage) tmp = (tmp+1) / 2;
		    losehp(tmp, Hallucination ? "amorous bag" : "carnivorous bag",
			   KILLED_BY_AN);
		    makeknown(BAG_OF_TRICKS);
		    free(lootlist);
		    return 1;
		}

		if (cobj_is_magic_chest(cobj))
		    pline("You carefully open the magic chest...");
		else
		    pline("You carefully open %s...", the(xname(cobj)));
		timepassed |= use_container(cobj, 0);
		if (multi < 0) {
		    /* container trap or BoHsplosion */
		    free(lootlist);
		    return 1;
		}
	    }
	    free(lootlist);
	}
    } else if (Confusion) {
	struct obj *goldob;
	/* Find a money object to mess with */
	for (goldob = invent; goldob; goldob = goldob->nobj) {
	    if (goldob->oclass == COIN_CLASS) break;
	}
	if (goldob){
	    long contribution = rnd((int)min(LARGEST_INT, goldob->quan));
	    if (contribution < goldob->quan)
		goldob = splitobj(goldob, contribution);
	    freeinv(goldob);

	    if (IS_THRONE(level->locations[u.ux][u.uy].typ)){
		struct obj *coffers;
		int pass;
		/* find the original coffers chest, or any chest */
		for (pass = 2; pass > -1; pass -= 2)
		    for (coffers = level->objlist; coffers; coffers = coffers->nobj)
			if ((coffers->otyp == CHEST || coffers->otyp == IRON_SAFE) && coffers->spe == pass)
			    goto gotit;	/* two level break */
gotit:
		if (coffers) {
	    verbalize("Thank you for your contribution to reduce the debt.");
		    add_to_container(coffers, goldob);
		    coffers->owt = weight(coffers);
		} else {
		    struct monst *mon = makemon(courtmon(&u.uz), level,
					    u.ux, u.uy, NO_MM_FLAGS);
		    if (mon) {
			add_to_minv(mon, goldob);
			pline("The exchequer accepts your contribution.");
			if (!rn2(50)) {
			    level->locations[u.ux][u.uy].typ = ROOM;
			    pline("The throne vanishes in a puff of logic.");
			    newsym(u.ux,u.uy);
			}
		    } else {
			dropy(goldob);
		    }
		}
	    } else {
		dropy(goldob);
		pline("Ok, now there is loot here.");
	    }
	    timepassed = 1;
	}
    } else if (IS_GRAVE(level->locations[cc.x][cc.y].typ)) {
	pline("You need to dig up the grave to effectively loot it...");
    }
    /*
     * 3.3.1 introduced directional looting for some things.
     */
    if (c != 'y' && mon_beside(u.ux, u.uy)) {
	schar dz;
	if (!get_adjacent_loc("Loot in what direction?", "Invalid loot location",
			u.ux, u.uy, &cc, &dz))
	    return timepassed;
	if (cc.x == u.ux && cc.y == u.uy) {
	    underfoot = TRUE;
	    if (container_at(cc.x, cc.y, FALSE))
		goto lootcont;
	} else
	    underfoot = FALSE;
	if (dz < 0) {
	    pline("You %s to loot on the %s.", dont_find_anything,
		ceiling(cc.x, cc.y));
	    timepassed = 1;
	    return timepassed;
	}
	mtmp = m_at(level, cc.x, cc.y);
	if (mtmp) timepassed = loot_mon(mtmp, &prev_inquiry, &prev_loot);

	/* Preserve pre-3.3.1 behaviour for containers.
	 * Adjust this if-block to allow container looting
	 * from one square away to change that in the future.
	 */
	if (!underfoot) {
	    if (container_at(cc.x, cc.y, FALSE)) {
		if (mtmp) {
		    pline("You can't loot anything %sthere with %s in the way.",
			    prev_inquiry ? "else " : "", mon_nam(mtmp));
		    return timepassed;
		} else {
		    pline("You have to be at a container to loot it.");
		}
	    } else {
		pline("You %s %sthere to loot.", dont_find_anything,
			(prev_inquiry || prev_loot) ? "else " : "");
		return timepassed;
	    }
	}
    } else if (c != 'y' && c != 'n') {
	pline("You %s %s to loot.", dont_find_anything,
		    underfoot ? "here" : "there");
    }
    return timepassed;
}